

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

bool CivetServer::getParam(char *data,size_t data_len,char *name,string *dst,size_t occurrence)

{
  bool bVar1;
  reference dst_00;
  size_type sVar2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_188;
  char *local_180;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_178;
  allocator_type local_159;
  undefined1 local_158 [8];
  vector<char,_std::allocator<char>_> vbuf;
  char local_138 [4];
  int r;
  char buf [256];
  size_t occurrence_local;
  string *dst_local;
  char *name_local;
  size_t data_len_local;
  char *data_local;
  
  buf._248_8_ = occurrence;
  vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
       mg_get_var2(data,data_len,name,local_138,0x100,occurrence);
  if ((int)vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ < 0) {
    if (vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ == -2) {
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_158,0x200,&local_159);
      std::allocator<char>::~allocator(&local_159);
      while( true ) {
        dst_00 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_158,0);
        sVar2 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)local_158);
        vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
             mg_get_var2(data,data_len,name,dst_00,sVar2,buf._248_8_);
        if (-1 < (int)vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_) break;
        if (vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ != -2) {
          bVar1 = false;
          goto LAB_001180b1;
        }
        sVar2 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)local_158);
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)local_158,sVar2 * 2);
      }
      local_178._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)local_158);
      local_188._M_current =
           (char *)std::vector<char,_std::allocator<char>_>::begin
                             ((vector<char,_std::allocator<char>_> *)local_158);
      local_180 = (char *)__gnu_cxx::
                          __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                          operator+(&local_188,
                                    (long)(int)vbuf.super__Vector_base<char,_std::allocator<char>_>.
                                               _M_impl._20_4_);
      std::__cxx11::string::
      assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                ((string *)dst,local_178,
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)local_180);
      data_local._7_1_ = 1;
      bVar1 = true;
LAB_001180b1:
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_158);
      if (bVar1) goto LAB_001180dc;
    }
    std::__cxx11::string::clear();
    data_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::assign((char *)dst,(ulong)local_138);
    data_local._7_1_ = 1;
  }
LAB_001180dc:
  return (bool)(data_local._7_1_ & 1);
}

Assistant:

bool
CivetServer::getParam(const char *data,
                      size_t data_len,
                      const char *name,
                      std::string &dst,
                      size_t occurrence)
{
	char buf[256];
	int r = mg_get_var2(data, data_len, name, buf, sizeof(buf), occurrence);
	if (r >= 0) {
		// dst can contain NUL characters
		dst.assign(buf, r);
		return true;
	} else if (r == -2) {
		// more buffer
		std::vector<char> vbuf(sizeof(buf) * 2);
		for (;;) {
			r = mg_get_var2(
			    data, data_len, name, &vbuf[0], vbuf.size(), occurrence);
			if (r >= 0) {
				dst.assign(vbuf.begin(), vbuf.begin() + r);
				return true;
			} else if (r != -2) {
				break;
			}
			// more buffer
			vbuf.resize(vbuf.size() * 2);
		}
	}
	dst.clear();
	return false;
}